

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O1

LogMessage * __thiscall
absl::lts_20250127::log_internal::LogMessage::AtLocation(LogMessage *this,string_view file,int line)

{
  LogMessageData *pLVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  size_t sVar5;
  long lVar6;
  
  pcVar4 = file._M_str;
  sVar5 = file._M_len;
  pLVar1 = (this->data_)._M_t.
           super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           ._M_t.
           super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           .
           super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
           ._M_head_impl;
  (pLVar1->entry).full_filename_._M_len = sVar5;
  *(char **)((long)&(pLVar1->entry).full_filename_ + 8) = pcVar4;
  if (sVar5 == 0) {
LAB_002bc3f2:
    lVar3 = 0;
  }
  else {
    lVar6 = sVar5 + 1;
    do {
      if (lVar6 == 1) goto LAB_002bc3f2;
      lVar3 = lVar6 + -1;
      lVar2 = lVar6 + -2;
      lVar6 = lVar3;
    } while (pcVar4[lVar2] != '/');
  }
  pLVar1 = (this->data_)._M_t.
           super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           ._M_t.
           super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           .
           super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
           ._M_head_impl;
  (pLVar1->entry).base_filename_._M_len = sVar5 - lVar3;
  *(char **)((long)&(pLVar1->entry).base_filename_ + 8) = pcVar4 + lVar3;
  (((this->data_)._M_t.
    super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
    ._M_t.
    super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
    .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
   _M_head_impl)->entry).line_ = line;
  LogBacktraceIfNeeded(this);
  return this;
}

Assistant:

LogMessage& LogMessage::AtLocation(absl::string_view file, int line) {
  data_->entry.full_filename_ = file;
  data_->entry.base_filename_ = Basename(file);
  data_->entry.line_ = line;
  LogBacktraceIfNeeded();
  return *this;
}